

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_EvalFunctionInternal
                  (JSContext *ctx,JSValue fun_obj,JSValue this_obj,JSVarRef **var_refs,
                  JSStackFrame *sf)

{
  int iVar1;
  uint uVar2;
  JSValueUnion m;
  JSRefCountHeader *p;
  JSValue JVar3;
  
  m = fun_obj.u;
  uVar2 = (uint)fun_obj.tag;
  if (uVar2 == 0xfffffffd) {
    iVar1 = *m.ptr;
    *(int *)m.ptr = iVar1 + -1;
    if (iVar1 < 2) {
      __JS_FreeValueRT(ctx->rt,fun_obj);
    }
    iVar1 = js_create_module_function(ctx,(JSModuleDef *)m.ptr);
    if (((iVar1 < 0) || (iVar1 = js_link_module(ctx,(JSModuleDef *)m.ptr), iVar1 < 0)) ||
       (JVar3 = js_evaluate_module(ctx,(JSModuleDef *)m.ptr), (int)JVar3.tag == 6)) {
      js_free_modules(ctx,JS_FREE_MODULE_NOT_EVALUATED);
      JVar3 = (JSValue)(ZEXT816(6) << 0x40);
    }
  }
  else if (uVar2 == 0xfffffffe) {
    JVar3 = js_closure(ctx,fun_obj,var_refs,sf);
    JVar3 = JS_CallFree(ctx,JVar3,this_obj,0,(JSValue *)0x0);
  }
  else {
    if ((0xfffffff4 < uVar2) && (iVar1 = *m.ptr, *(int *)m.ptr = iVar1 + -1, iVar1 < 2)) {
      __JS_FreeValueRT(ctx->rt,fun_obj);
    }
    JS_ThrowTypeError(ctx,"bytecode function expected");
    JVar3 = (JSValue)(ZEXT816(6) << 0x40);
  }
  return JVar3;
}

Assistant:

static JSValue JS_EvalFunctionInternal(JSContext *ctx, JSValue fun_obj,
                                       JSValueConst this_obj,
                                       JSVarRef **var_refs, JSStackFrame *sf)
{
    JSValue ret_val;
    uint32_t tag;

    tag = JS_VALUE_GET_TAG(fun_obj);
    if (tag == JS_TAG_FUNCTION_BYTECODE) {
        fun_obj = js_closure(ctx, fun_obj, var_refs, sf);
        ret_val = JS_CallFree(ctx, fun_obj, this_obj, 0, NULL);
    } else if (tag == JS_TAG_MODULE) {
        JSModuleDef *m;
        m = JS_VALUE_GET_PTR(fun_obj);
        /* the module refcount should be >= 2 */
        JS_FreeValue(ctx, fun_obj);
        if (js_create_module_function(ctx, m) < 0)
            goto fail;
        if (js_link_module(ctx, m) < 0)
            goto fail;
        ret_val = js_evaluate_module(ctx, m);
        if (JS_IsException(ret_val)) {
        fail:
            js_free_modules(ctx, JS_FREE_MODULE_NOT_EVALUATED);
            return JS_EXCEPTION;
        }
    } else {
        JS_FreeValue(ctx, fun_obj);
        ret_val = JS_ThrowTypeError(ctx, "bytecode function expected");
    }
    return ret_val;
}